

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

void expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *issues,vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
                        *cellmlElementTypes,
               vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *levels,
               vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
               *referenceRules,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *urls,LoggerPtr *logger)

{
  pointer pbVar1;
  pointer pCVar2;
  pointer pLVar3;
  pointer pRVar4;
  char cVar5;
  undefined4 uVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar;
  long *local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  unsigned_long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LoggerPtr *local_68;
  CellmlElementType local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
  *local_50;
  vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *local_48;
  vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_> *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_a8 = (long *)((long)(issues->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(issues->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
  local_68 = logger;
  local_58 = urls;
  local_50 = referenceRules;
  local_48 = levels;
  local_40 = cellmlElementTypes;
  local_38 = issues;
  local_98 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"issues.size()","logger->issueCount()",(unsigned_long *)&local_a8
             ,&local_98);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xf9,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8 = (long *)((long)(local_40->
                            super__Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_40->
                            super__Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2);
  local_98 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"cellmlElementTypes.size()","logger->issueCount()",
             (unsigned_long *)&local_a8,&local_98);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfa,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8 = (long *)((long)(local_48->
                            super__Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_48->
                            super__Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2);
  local_98 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"levels.size()","logger->issueCount()",(unsigned_long *)&local_a8
             ,&local_98);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfb,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8 = (long *)((long)(local_50->
                            super__Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_50->
                            super__Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2);
  local_98 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"referenceRules.size()","logger->issueCount()",
             (unsigned_long *)&local_a8,&local_98);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfc,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8 = (long *)((long)(local_58->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_58->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
  local_98 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"urls.size()","logger->issueCount()",(unsigned_long *)&local_a8,
             &local_98);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfd,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar7 = libcellml::Logger::issueCount();
  if (lVar7 != 0) {
    lVar7 = 0;
    lVar11 = 0;
    uVar12 = 0;
    do {
      pbVar1 = (local_38->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_38->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar12)
      {
        return;
      }
      libcellml::Logger::issue((ulong)&local_98);
      libcellml::Issue::description_abi_cxx11_();
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&local_a8,"issues.at(i)","logger->issue(i)->description()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar1->_M_dataplus)._M_p + lVar11),&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
      if (local_a8._0_1_ == (Message)0x0) {
        testing::Message::Message((Message *)&local_88);
        pcVar10 = "";
        if (local_a0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = ((local_a0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0xff,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
          cVar5 = testing::internal::IsTrue(true);
          if ((cVar5 != '\0') && ((long *)local_88._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
          }
          local_88._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pCVar2 = (local_40->
               super__Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_40->
                        super__Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 2) <= uVar12)
      {
LAB_00107986:
        uVar9 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12);
        __clang_call_terminate(uVar9);
      }
      libcellml::Logger::issue((ulong)&local_98);
      libcellml::Issue::item();
      local_5c = libcellml::AnyCellmlElement::type();
      testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
                ((internal *)&local_88,"cellmlElementTypes.at(i)","logger->issue(i)->item()->type()"
                 ,(CellmlElementType *)((long)pCVar2 + lVar7),&local_5c);
      if (local_a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.ptr_);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        pcVar10 = "";
        if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
          pcVar10 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x100,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if (local_a8 != (long *)0x0) {
          cVar5 = testing::internal::IsTrue(true);
          if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
            (**(code **)(*local_a8 + 8))();
          }
          local_a8 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pLVar3 = (local_48->
               super__Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_48->
                        super__Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pLVar3 >> 2) <= uVar12)
      goto LAB_00107986;
      libcellml::Logger::issue((ulong)&local_a8);
      uVar6 = libcellml::Issue::level();
      local_98 = CONCAT44(local_98._4_4_,uVar6);
      testing::internal::CmpHelperEQ<libcellml::Issue::Level,libcellml::Issue::Level>
                ((internal *)&local_88,"levels.at(i)","logger->issue(i)->level()",
                 (Level *)((long)pLVar3 + lVar7),(Level *)&local_98);
      if (local_a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.ptr_);
      }
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        pcVar10 = "";
        if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
          pcVar10 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x101,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if (local_a8 != (long *)0x0) {
          cVar5 = testing::internal::IsTrue(true);
          if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
            (**(code **)(*local_a8 + 8))();
          }
          local_a8 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pRVar4 = (local_50->
               super__Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_50->
                        super__Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 2) <= uVar12)
      goto LAB_00107986;
      libcellml::Logger::issue((ulong)&local_a8);
      uVar6 = libcellml::Issue::referenceRule();
      local_98 = CONCAT44(local_98._4_4_,uVar6);
      testing::internal::
      CmpHelperEQ<libcellml::Issue::ReferenceRule,libcellml::Issue::ReferenceRule>
                ((internal *)&local_88,"referenceRules.at(i)","logger->issue(i)->referenceRule()",
                 (ReferenceRule *)((long)pRVar4 + lVar7),(ReferenceRule *)&local_98);
      if (local_a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.ptr_);
      }
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        pcVar10 = "";
        if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
          pcVar10 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x102,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if (local_a8 != (long *)0x0) {
          cVar5 = testing::internal::IsTrue(true);
          if ((cVar5 != '\0') && (local_a8 != (long *)0x0)) {
            (**(code **)(*local_a8 + 8))();
          }
          local_a8 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pbVar1 = (local_58->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_58->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar12)
      goto LAB_00107986;
      libcellml::Logger::issue((ulong)&local_98);
      libcellml::Issue::url_abi_cxx11_();
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&local_a8,"urls.at(i)","logger->issue(i)->url()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar1->_M_dataplus)._M_p + lVar11),&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
      if (local_a8._0_1_ == (Message)0x0) {
        testing::Message::Message((Message *)&local_88);
        pcVar10 = "";
        if (local_a0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = ((local_a0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x103,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
          cVar5 = testing::internal::IsTrue(true);
          if ((cVar5 != '\0') && ((long *)local_88._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
          }
          local_88._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar12 = uVar12 + 1;
      uVar8 = libcellml::Logger::issueCount();
      lVar11 = lVar11 + 0x20;
      lVar7 = lVar7 + 4;
    } while (uVar12 < uVar8);
  }
  return;
}

Assistant:

void expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls(const std::vector<std::string> &issues,
                                                                 const std::vector<libcellml::CellmlElementType> &cellmlElementTypes,
                                                                 const std::vector<libcellml::Issue::Level> &levels,
                                                                 const std::vector<libcellml::Issue::ReferenceRule> &referenceRules,
                                                                 const std::vector<std::string> &urls,
                                                                 const libcellml::LoggerPtr &logger)
{
    EXPECT_EQ(issues.size(), logger->issueCount());
    EXPECT_EQ(cellmlElementTypes.size(), logger->issueCount());
    EXPECT_EQ(levels.size(), logger->issueCount());
    EXPECT_EQ(referenceRules.size(), logger->issueCount());
    EXPECT_EQ(urls.size(), logger->issueCount());
    for (size_t i = 0; i < logger->issueCount() && i < issues.size(); ++i) {
        EXPECT_EQ(issues.at(i), logger->issue(i)->description());
        EXPECT_EQ(cellmlElementTypes.at(i), logger->issue(i)->item()->type());
        EXPECT_EQ(levels.at(i), logger->issue(i)->level());
        EXPECT_EQ(referenceRules.at(i), logger->issue(i)->referenceRule());
        EXPECT_EQ(urls.at(i), logger->issue(i)->url());
    }
}